

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O3

void __thiscall adios2::transport::FileFStream::FileFStream(FileFStream *this,Comm *comm)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"File","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"fstream","");
  Transport::Transport(&this->super_Transport,&local_40,&local_60,comm);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileFStream_008738d0;
  std::fstream::fstream(&this->m_FileStream);
  this->m_IsOpening = false;
  (this->m_OpenFuture).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_OpenFuture).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

FileFStream::FileFStream(helper::Comm const &comm) : Transport("File", "fstream", comm) {}